

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_dbref(void)

{
  uint uVar1;
  _Bool _Var2;
  int32_t iVar3;
  int iVar4;
  int __fd;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  bson_oid_t *pbVar8;
  undefined8 uVar9;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  ulong uVar10;
  bool bVar11;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  int i;
  int n_tests;
  dbref_test_t tests [4];
  _Bool r;
  bson_t b;
  bson_t *bson_with_metadata;
  char *json_with_metadata;
  bson_t *bson_with_subdoc_id;
  char *json_with_subdoc_id;
  bson_t *bson_with_int_id;
  char *json_with_int_id;
  bson_t *bson_with_objectid;
  char *json_with_objectid;
  bson_error_t error;
  undefined8 in_stack_fffffffffffffb18;
  undefined4 uVar12;
  uint local_468;
  uint local_404;
  uint local_400;
  int local_3d8;
  char *local_3d0;
  long local_3c8;
  char *local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined8 local_398;
  byte local_381;
  undefined1 local_380 [4];
  uint local_37c;
  undefined8 local_2f8;
  char *local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  undefined8 local_2d8;
  char *local_2d0;
  long local_2c8;
  char *local_2c0;
  undefined1 local_2b8 [8];
  undefined1 auStack_2b0 [640];
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_2c0 = 
  "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
  uVar5 = bson_bcon_magic();
  pcVar6 = bcon_ensure_const_char_ptr("collection");
  uVar7 = bson_bcon_magic();
  pbVar8 = oid_zero();
  pbVar8 = bcon_ensure_const_oid_ptr(pbVar8);
  local_2c8 = bcon_new(0,"key","{","$ref",uVar5,0,pcVar6,"$id",uVar7,CONCAT44(uVar12,6),pbVar8,"}",0
                      );
  local_2d0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
  uVar5 = bson_bcon_magic();
  pcVar6 = bcon_ensure_const_char_ptr("collection");
  uVar7 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  local_2d8 = bcon_new(0,"key","{","$ref",uVar5,0,pcVar6,"$id",uVar7,0xf,iVar3,"}",0);
  local_2e0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
  uVar5 = bson_bcon_magic();
  pcVar6 = bcon_ensure_const_char_ptr("collection");
  uVar7 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  local_2e8 = bcon_new(0,"key","{","$ref",uVar5,0,pcVar6,"$id","{","a",uVar7,0xf,iVar3,"}","}",0);
  local_2f0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
  uVar5 = bson_bcon_magic();
  pcVar6 = bcon_ensure_const_char_ptr("collection");
  uVar7 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  uVar9 = bson_bcon_magic();
  _Var2 = bcon_ensure_bool(true);
  local_2f8 = bcon_new(0,"key","{","$ref",uVar5,0,pcVar6,"$id",uVar7,0xf,iVar3,"meta",uVar9,7,_Var2,
                       "}",0);
  local_3d0 = local_2c0;
  local_3c8 = local_2c8;
  local_3c0 = local_2d0;
  local_3b8 = local_2d8;
  local_3b0 = local_2e0;
  local_3a8 = local_2e8;
  local_3a0 = local_2f0;
  local_398 = local_2f8;
  local_3d8 = 0;
  while( true ) {
    if (3 < local_3d8) {
      for (local_3d8 = 0; local_3d8 < 4; local_3d8 = local_3d8 + 1) {
        bson_destroy((&local_3c8)[(long)local_3d8 * 2]);
      }
      return;
    }
    local_381 = bson_init_from_json(local_380,(&local_3d0)[(long)local_3d8 * 2],0xffffffffffffffff,
                                    local_2b8);
    local_381 = local_381 & 1;
    if (local_381 == 0) {
      fprintf(_stderr,"%s\n",auStack_2b0);
    }
    if ((local_381 & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x732,"test_bson_json_dbref","r");
      abort();
    }
    __buf = (void *)bson_get_data(local_380);
    __buf_00 = (void *)bson_get_data((&local_3c8)[(long)local_3d8 * 2]);
    local_404 = 0xffffffff;
    bVar11 = true;
    if (*(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4) == local_37c) {
      __s1 = (void *)bson_get_data((&local_3c8)[(long)local_3d8 * 2]);
      __s2 = (void *)bson_get_data(local_380);
      iVar4 = memcmp(__s1,__s2,(ulong)*(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4));
      bVar11 = iVar4 != 0;
    }
    if (bVar11) break;
    bson_destroy(local_380);
    local_3d8 = local_3d8 + 1;
  }
  uVar5 = bson_as_canonical_extended_json(local_380,0);
  uVar7 = bson_as_canonical_extended_json((&local_3c8)[(long)local_3d8 * 2],0);
  local_400 = 0;
  while( true ) {
    bVar11 = false;
    if (local_400 < local_37c) {
      bVar11 = local_400 < *(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4);
    }
    if (!bVar11) goto LAB_0012fd14;
    if (*(char *)((long)__buf + (ulong)local_400) != *(char *)((long)__buf_00 + (ulong)local_400))
    break;
    local_400 = local_400 + 1;
  }
  local_404 = local_400;
LAB_0012fd14:
  if (local_404 == 0xffffffff) {
    if (local_37c < *(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4)) {
      local_468 = *(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4);
    }
    else {
      local_468 = local_37c;
    }
    local_404 = local_468 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_404,uVar5,uVar7);
  iVar4 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar4 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x733,"test_bson_json_dbref","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x733,"test_bson_json_dbref","fd2 != -1");
    abort();
  }
  uVar10 = write(iVar4,__buf,(ulong)local_37c);
  if (local_37c == uVar10) {
    uVar1 = *(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4);
    uVar10 = write(__fd,__buf_00,(ulong)*(uint *)((&local_3c8)[(long)local_3d8 * 2] + 4));
    if (uVar1 == uVar10) {
      close(iVar4);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x733,"test_bson_json_dbref","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x733,"test_bson_json_dbref",
            "(tests[i].expected_bson)->len == bson_write (fd2, expected_data, (tests[i].expected_bson)->len)"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x733,"test_bson_json_dbref","(&b)->len == bson_write (fd1, bson_data, (&b)->len)");
  abort();
}

Assistant:

static void
test_bson_json_dbref (void)
{
   bson_error_t error;

   const char *json_with_objectid =
      "{ \"key\": {"
      "\"$ref\": \"collection\","
      "\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";

   bson_t *bson_with_objectid = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_OID (oid_zero ()),
                                          "}");

   const char *json_with_int_id = "{ \"key\": {"
                                  "\"$ref\": \"collection\","
                                  "\"$id\": 1}}";

   bson_t *bson_with_int_id = BCON_NEW (
      "key", "{", "$ref", BCON_UTF8 ("collection"), "$id", BCON_INT32 (1), "}");

   const char *json_with_subdoc_id = "{ \"key\": {"
                                     "\"$ref\": \"collection\","
                                     "\"$id\": {\"a\": 1}}}";

   bson_t *bson_with_subdoc_id = BCON_NEW ("key",
                                           "{",
                                           "$ref",
                                           BCON_UTF8 ("collection"),
                                           "$id",
                                           "{",
                                           "a",
                                           BCON_INT32 (1),
                                           "}",
                                           "}");

   const char *json_with_metadata = "{ \"key\": {"
                                    "\"$ref\": \"collection\","
                                    "\"$id\": 1,"
                                    "\"meta\": true}}";

   bson_t *bson_with_metadata = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_INT32 (1),
                                          "meta",
                                          BCON_BOOL (true),
                                          "}");

   bson_t b;
   bool r;

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } dbref_test_t;

   dbref_test_t tests[] = {
      {json_with_objectid, bson_with_objectid},
      {json_with_int_id, bson_with_int_id},
      {json_with_subdoc_id, bson_with_subdoc_id},
      {json_with_metadata, bson_with_metadata},
   };

   int n_tests = sizeof (tests) / sizeof (dbref_test_t);
   int i;

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);
      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}